

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::SetLocal(VirtualMachine *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pVVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pcVar5;
  Variable VVar6;
  string local_48;
  
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"No stack frame found in SetLocal","");
    panic(this,&local_48);
  }
  this_00 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pcVar3 = (pointer)getByteCodeParameter(this);
  if ((pointer)((long)(peVar1->locals).
                      super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar1->locals).
                      super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) <= pcVar3) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Index out of bounds in SetLocal","");
    panic(this,&local_48);
  }
  VVar6 = popOpStack(this);
  pVVar2 = (peVar1->locals).
           super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (pointer)((long)(peVar1->locals).
                           super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4);
  if (pcVar5 <= pcVar3) {
    uVar4 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pcVar3,pcVar5);
    if (local_48._M_dataplus._M_p != pcVar3) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    _Unwind_Resume(uVar4);
  }
  pVVar2[(long)pcVar3].type = VVar6.type;
  ((anon_union_8_6_52c89740_for_Variable_1 *)((long)(pVVar2 + (long)pcVar3) + 8))->integerValue =
       (int64_t)VVar6.field_1;
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void runtime::VirtualMachine::SetLocal() {
  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in SetLocal");
    return;
  }

  auto stackFrame = this->stackFrame;

  auto locals = &stackFrame->locals;

  auto index = this->getByteCodeParameter();

  if (index >= locals->size()) {
    this->panic("Index out of bounds in SetLocal");
    return;
  }

  Variable top = this->popOpStack();

  locals->at(index) = top;

  this->advance();
}